

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O3

bool CMakeWriter::gather_all_library_dependencies
               (ChibiInfo *chibi_info,ChibiLibrary *library,
               vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>
               *library_dependencies)

{
  _Rb_tree_header *p_Var1;
  ChibiLibrary *pCVar2;
  value_type *pvVar3;
  const_iterator cVar4;
  bool bVar5;
  value_type *__x;
  ChibiInfo *line;
  ChibiLibrary *resolved_library;
  deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> stack;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  traversed_libraries;
  ChibiLibrary *local_c0;
  _Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> local_b8;
  ChibiInfo *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_68 = chibi_info;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::_Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::_M_initialize_map
            (&local_b8,0);
  local_c0 = library;
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<ChibiLibrary_const*,std::allocator<ChibiLibrary_const*>>::
    _M_push_back_aux<ChibiLibrary_const*>
              ((deque<ChibiLibrary_const*,std::allocator<ChibiLibrary_const*>> *)&local_b8,&local_c0
              );
  }
  else {
    *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = library;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_60,&library->name);
  bVar5 = true;
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pCVar2 = *local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
      pvVar3 = (pCVar2->library_dependencies).
               super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (__x = (pCVar2->library_dependencies).
                 super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pvVar3; __x = __x + 1) {
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,&__x->name);
        if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_60,&__x->name);
          std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::push_back
                    (library_dependencies,__x);
          if (__x->type == kType_Generated) {
            line = local_68;
            local_c0 = ChibiInfo::find_library(local_68,(__x->name)._M_dataplus._M_p);
            if (local_c0 == (ChibiLibrary *)0x0) {
              bVar5 = false;
              report_error((char *)line,"failed to resolve library dependency: %s for library %s",
                           (__x->name)._M_dataplus._M_p,(pCVar2->name)._M_dataplus._M_p);
              goto LAB_00113507;
            }
            if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<ChibiLibrary_const*,std::allocator<ChibiLibrary_const*>>::
              _M_push_back_aux<ChibiLibrary_const*const&>
                        ((deque<ChibiLibrary_const*,std::allocator<ChibiLibrary_const*>> *)&local_b8
                         ,&local_c0);
            }
            else {
              *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_c0;
              local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
      }
      if (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first);
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
    bVar5 = true;
  }
LAB_00113507:
  std::_Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::~_Deque_base
            (&local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return bVar5;
}

Assistant:

static bool gather_all_library_dependencies(const ChibiInfo & chibi_info, const ChibiLibrary & library, std::vector<ChibiLibraryDependency> & library_dependencies)
	{
		std::set<std::string> traversed_libraries;
		std::deque<const ChibiLibrary*> stack;
		
		stack.push_back(&library);
		
		traversed_libraries.insert(library.name);
		
		while (stack.empty() == false)
		{
			const ChibiLibrary * library = stack.front();
			
			for (auto & library_dependency : library->library_dependencies)
			{
				if (traversed_libraries.count(library_dependency.name) == 0)
				{
					traversed_libraries.insert(library_dependency.name);
					
					library_dependencies.push_back(library_dependency);
					
					if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
					{
						const ChibiLibrary * resolved_library = chibi_info.find_library(library_dependency.name.c_str());
						
						if (resolved_library == nullptr)
						{
							report_error(nullptr, "failed to resolve library dependency: %s for library %s", library_dependency.name.c_str(), library->name.c_str());
							return false;
						}

						stack.push_back(resolved_library);
					}
				}
			}
			
			stack.pop_front();
		}
		
		return true;
	}